

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_suppression.c
# Opt level: O0

void cftfsub(size_t n,float *a,float *w)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  float *in_RDX;
  float *in_RSI;
  ulong in_RDI;
  float x3i;
  float x3r;
  float x2i;
  float x2r;
  float x1i;
  float x1r;
  float x0i;
  float x0r;
  size_t l;
  size_t j3;
  size_t j2;
  size_t j1;
  size_t j;
  float *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  ulong local_40;
  ulong local_20;
  
  local_40 = 2;
  if (8 < in_RDI) {
    cft1st(in_RDI,in_RSI,in_RDX);
    for (local_40 = 8; local_40 << 2 < in_RDI; local_40 = local_40 << 2) {
      cftmdl(CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98
             ,(float *)0x11b8aa);
    }
  }
  if (local_40 << 2 == in_RDI) {
    for (local_20 = 0; local_20 < local_40; local_20 = local_20 + 2) {
      lVar17 = local_20 + local_40;
      lVar18 = lVar17 + local_40;
      lVar19 = lVar18 + local_40;
      fVar1 = in_RSI[local_20];
      fVar2 = in_RSI[lVar17];
      fVar3 = in_RSI[local_20 + 1];
      fVar4 = in_RSI[lVar17 + 1];
      fVar5 = in_RSI[local_20];
      fVar6 = in_RSI[lVar17];
      fVar7 = in_RSI[local_20 + 1];
      fVar8 = in_RSI[lVar17 + 1];
      fVar9 = in_RSI[lVar18];
      fVar10 = in_RSI[lVar19];
      fVar11 = in_RSI[lVar18 + 1];
      fVar12 = in_RSI[lVar19 + 1];
      fVar13 = in_RSI[lVar18];
      fVar14 = in_RSI[lVar19];
      fVar15 = in_RSI[lVar18 + 1];
      fVar16 = in_RSI[lVar19 + 1];
      in_RSI[local_20] = fVar1 + fVar2 + fVar9 + fVar10;
      in_RSI[local_20 + 1] = fVar3 + fVar4 + fVar11 + fVar12;
      in_RSI[lVar18] = (fVar1 + fVar2) - (fVar9 + fVar10);
      in_RSI[lVar18 + 1] = (fVar3 + fVar4) - (fVar11 + fVar12);
      in_RSI[lVar17] = (fVar5 - fVar6) - (fVar15 - fVar16);
      in_RSI[lVar17 + 1] = (fVar7 - fVar8) + (fVar13 - fVar14);
      in_RSI[lVar19] = (fVar5 - fVar6) + (fVar15 - fVar16);
      in_RSI[lVar19 + 1] = (fVar7 - fVar8) - (fVar13 - fVar14);
    }
  }
  else {
    for (local_20 = 0; local_20 < local_40; local_20 = local_20 + 2) {
      lVar17 = local_20 + local_40;
      fVar1 = in_RSI[local_20];
      fVar2 = in_RSI[lVar17];
      fVar3 = in_RSI[local_20 + 1];
      fVar4 = in_RSI[lVar17 + 1];
      in_RSI[local_20] = in_RSI[lVar17] + in_RSI[local_20];
      in_RSI[local_20 + 1] = in_RSI[lVar17 + 1] + in_RSI[local_20 + 1];
      in_RSI[lVar17] = fVar1 - fVar2;
      in_RSI[lVar17 + 1] = fVar3 - fVar4;
    }
  }
  return;
}

Assistant:

static void cftfsub(size_t n, float *a, float *w) {
    size_t j, j1, j2, j3, l;
    float x0r, x0i, x1r, x1i, x2r, x2i, x3r, x3i;

    l = 2;
    if (n > 8) {
        cft1st(n, a, w);
        l = 8;
        while ((l << 2) < n) {
            cftmdl(n, l, a, w);
            l <<= 2;
        }
    }
    if ((l << 2) == n) {
        for (j = 0; j < l; j += 2) {
            j1 = j + l;
            j2 = j1 + l;
            j3 = j2 + l;
            x0r = a[j] + a[j1];
            x0i = a[j + 1] + a[j1 + 1];
            x1r = a[j] - a[j1];
            x1i = a[j + 1] - a[j1 + 1];
            x2r = a[j2] + a[j3];
            x2i = a[j2 + 1] + a[j3 + 1];
            x3r = a[j2] - a[j3];
            x3i = a[j2 + 1] - a[j3 + 1];
            a[j] = x0r + x2r;
            a[j + 1] = x0i + x2i;
            a[j2] = x0r - x2r;
            a[j2 + 1] = x0i - x2i;
            a[j1] = x1r - x3i;
            a[j1 + 1] = x1i + x3r;
            a[j3] = x1r + x3i;
            a[j3 + 1] = x1i - x3r;
        }
    } else {
        for (j = 0; j < l; j += 2) {
            j1 = j + l;
            x0r = a[j] - a[j1];
            x0i = a[j + 1] - a[j1 + 1];
            a[j] += a[j1];
            a[j + 1] += a[j1 + 1];
            a[j1] = x0r;
            a[j1 + 1] = x0i;
        }
    }
}